

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRHS.cpp
# Opt level: O0

void __thiscall HEkkDualRHS::chooseNormal(HEkkDualRHS *this,HighsInt *chIndex)

{
  double dVar1;
  HighsTimer *pHVar2;
  bool bVar3;
  byte bVar4;
  HighsInt HVar5;
  reference pvVar6;
  reference pvVar7;
  HEkkDualRHS *in_RSI;
  HighsSimplexAnalysis *in_RDI;
  double in_stack_00000008;
  HEkkDualRHS *in_stack_00000010;
  HighsInt createListAgain;
  double myWeight_1;
  double myInfeas_1;
  HighsInt iRow_1;
  HighsInt i;
  HighsInt end_1;
  HighsInt start_1;
  HighsInt section_1;
  vector<double,_std::allocator<double>_> *edge_weight_1;
  HighsInt bestIndex_1;
  double bestMerit_1;
  HighsInt randomStart_1;
  double myWeight;
  double myInfeas;
  HighsInt iRow;
  HighsInt end;
  HighsInt start;
  HighsInt section;
  HighsInt bestIndex;
  double bestMerit;
  HighsInt randomStart;
  HighsInt numRow;
  vector<double,_std::allocator<double>_> *edge_weight;
  bool keep_timer_running;
  HighsInt in_stack_ffffffffffffff40;
  int iVar8;
  HighsInt in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff48;
  int iVar9;
  HighsInt in_stack_ffffffffffffff4c;
  int local_88;
  int local_7c;
  int local_6c;
  double local_68;
  int local_44;
  int local_38;
  int local_34;
  double local_30;
  undefined7 in_stack_ffffffffffffffe8;
  
  if (*(int *)&(in_RDI->thread_simplex_clocks).
               super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>._M_impl.
               super__Vector_impl_data._M_finish == 0) {
    *(undefined4 *)&in_RSI->ekk_instance_ = 0xffffffff;
  }
  else {
    bVar4 = HighsSimplexAnalysis::simplexTimerRunning
                      ((HighsSimplexAnalysis *)
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       in_stack_ffffffffffffff44,in_stack_ffffffffffffff40);
    if (!(bool)bVar4) {
      HighsSimplexAnalysis::simplexTimerStart
                (in_RDI,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
    }
    pHVar2 = in_RDI->timer_;
    if (*(int *)&(in_RDI->thread_simplex_clocks).
                 super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>._M_impl.
                 super__Vector_impl_data._M_finish < 0) {
      iVar8 = -*(int *)&(in_RDI->thread_simplex_clocks).
                        super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
      HVar5 = HighsRandom::integer
                        ((HighsRandom *)
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                         in_stack_ffffffffffffff44);
      local_30 = 0.0;
      local_34 = -1;
      for (local_38 = 0; local_38 < 2; local_38 = local_38 + 1) {
        in_stack_ffffffffffffff48 = iVar8;
        in_stack_ffffffffffffff4c = HVar5;
        local_44 = HVar5;
        iVar9 = iVar8;
        if (local_38 != 0) {
          in_stack_ffffffffffffff48 = HVar5;
          in_stack_ffffffffffffff4c = 0;
          local_44 = 0;
          iVar9 = HVar5;
        }
        for (; local_44 < iVar9; local_44 = local_44 + 1) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)&in_RDI->numTot,
                              (long)local_44);
          if (1e-50 < *pvVar6) {
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)&in_RDI->numTot,
                                (long)local_44);
            dVar1 = *pvVar6;
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)
                                &pHVar2[0x4f].clock_num_call.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,(long)local_44);
            if (local_30 * *pvVar6 < dVar1) {
              local_30 = dVar1 / *pvVar6;
              local_34 = local_44;
            }
          }
        }
      }
      *(int *)&in_RSI->ekk_instance_ = local_34;
    }
    else {
      HVar5 = HighsRandom::integer
                        ((HighsRandom *)
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                         in_stack_ffffffffffffff44);
      local_68 = 0.0;
      local_6c = -1;
      pHVar2 = in_RDI->timer_;
      for (local_7c = 0; local_7c < 2; local_7c = local_7c + 1) {
        if (local_7c == 0) {
          local_88 = HVar5;
          iVar8 = *(int *)&(in_RDI->thread_simplex_clocks).
                           super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          local_88 = 0;
          iVar8 = HVar5;
        }
        for (; local_88 < iVar8; local_88 = local_88 + 1) {
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              &(in_RDI->thread_factor_clocks).
                               super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_88);
          iVar9 = *pvVar7;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)&in_RDI->numTot,(long)iVar9
                             );
          if (1e-50 < *pvVar6) {
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)&in_RDI->numTot,
                                (long)iVar9);
            dVar1 = *pvVar6;
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)
                                &pHVar2[0x4f].clock_num_call.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,(long)iVar9);
            if (local_68 * *pvVar6 < dVar1) {
              local_68 = dVar1 / *pvVar6;
              local_6c = iVar9;
            }
          }
        }
      }
      if (local_6c == -1) {
        bVar3 = 0.0 < (double)(in_RDI->thread_simplex_clocks).
                              super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>.
                              _M_impl.super__Vector_impl_data._M_start;
      }
      else {
        bVar3 = local_68 <=
                (double)(in_RDI->thread_simplex_clocks).
                        super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>.
                        _M_impl.super__Vector_impl_data._M_start * 0.99;
      }
      if (bVar3) {
        createInfeasList(in_stack_00000010,in_stack_00000008);
        chooseNormal(in_RSI,(HighsInt *)CONCAT17(bVar4,in_stack_ffffffffffffffe8));
      }
      *(int *)&in_RSI->ekk_instance_ = local_6c;
    }
    if ((bVar4 & 1) == 0) {
      HighsSimplexAnalysis::simplexTimerStop
                (in_RDI,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
    }
  }
  return;
}

Assistant:

void HEkkDualRHS::chooseNormal(HighsInt* chIndex) {
  // Moved the following to the top to avoid starting the clock for a trivial
  // call. NB Must still call HighsInt to maintain sequence of random numbers
  // for code reproducibility!! Never mind if we're not timing the random number
  // call!!
  // HighsInt random = ekk_instance_.random_.integer();
  if (workCount == 0) {
    *chIndex = -1;
    return;
  }

  // Since chooseNormal calls itself, only start the clock if it's not
  // currently running
  bool keep_timer_running = analysis->simplexTimerRunning(ChuzrDualClock);
  //      timer.clock_start[info.clock_[ChuzrDualClock]] < 0;
  if (!keep_timer_running) {
    analysis->simplexTimerStart(ChuzrDualClock);
  }

  std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
  if (workCount < 0) {
    // DENSE mode
    const HighsInt numRow = -workCount;
    HighsInt randomStart = ekk_instance_.random_.integer(numRow);
    double bestMerit = 0;
    HighsInt bestIndex = -1;
    for (HighsInt section = 0; section < 2; section++) {
      const HighsInt start = (section == 0) ? randomStart : 0;
      const HighsInt end = (section == 0) ? numRow : randomStart;
      for (HighsInt iRow = start; iRow < end; iRow++) {
        if (work_infeasibility[iRow] > kHighsZero) {
          const double myInfeas = work_infeasibility[iRow];
          const double myWeight = edge_weight[iRow];
          //	  printf("Dense: Row %4" HIGHSINT_FORMAT " weight = %g\n", iRow,
          // myWeight);
          if (bestMerit * myWeight < myInfeas) {
            bestMerit = myInfeas / myWeight;
            bestIndex = iRow;
          }
        }
      }
    }
    *chIndex = bestIndex;
  } else {
    // SPARSE mode
    HighsInt randomStart = ekk_instance_.random_.integer(workCount);
    double bestMerit = 0;
    HighsInt bestIndex = -1;
    std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
    for (HighsInt section = 0; section < 2; section++) {
      const HighsInt start = (section == 0) ? randomStart : 0;
      const HighsInt end = (section == 0) ? workCount : randomStart;
      for (HighsInt i = start; i < end; i++) {
        HighsInt iRow = workIndex[i];
        if (work_infeasibility[iRow] > kHighsZero) {
          const double myInfeas = work_infeasibility[iRow];
          const double myWeight = edge_weight[iRow];
          /*
          const double myMerit = myInfeas / myWeight;
          printf("CHUZR: iRow = %6" HIGHSINT_FORMAT "; Infeas = %11.4g; Weight =
          %11.4g; Merit = %11.4g\n", iRow, myInfeas, myWeight, myMerit);
          */
          if (bestMerit * myWeight < myInfeas) {
            bestMerit = myInfeas / myWeight;
            bestIndex = iRow;
          }
        }
      }
    }

    HighsInt createListAgain = 0;
    if (bestIndex == -1) {
      createListAgain = workCutoff > 0;
    } else if (bestMerit <= workCutoff * 0.99) {
      createListAgain = 1;
    }
    if (createListAgain) {
      createInfeasList(0);
      chooseNormal(&bestIndex);
    }
    *chIndex = bestIndex;
  }
  // Since chooseNormal calls itself, only stop the clock if it's not currently
  // running
  if (!keep_timer_running) analysis->simplexTimerStop(ChuzrDualClock);
}